

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O1

int pt_pkt_sync_backward(pt_packet_decoder *decoder)

{
  int iVar1;
  uint8_t *pos;
  uint8_t *sync;
  uint8_t *local_10;
  
  if (decoder != (pt_packet_decoder *)0x0) {
    pos = decoder->pos;
    if (pos == (uint8_t *)0x0) {
      pos = (decoder->config).end;
    }
    iVar1 = pt_sync_backward(&local_10,pos,&decoder->config);
    if (-1 < iVar1) {
      decoder->sync = local_10;
      decoder->pos = local_10;
      iVar1 = 0;
    }
    return iVar1;
  }
  return -2;
}

Assistant:

int pt_pkt_sync_backward(struct pt_packet_decoder *decoder)
{
	const uint8_t *pos, *sync;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	pos = decoder->pos;
	if (!pos)
		pos = decoder->config.end;

	errcode = pt_sync_backward(&sync, pos, &decoder->config);
	if (errcode < 0)
		return errcode;

	decoder->sync = sync;
	decoder->pos = sync;

	return 0;
}